

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O1

void quiver_absorb_num(player *p,object *obj,int *n_add_pack,int *n_to_quiver)

{
  ushort uVar1;
  object *obj_00;
  int iVar2;
  _Bool _Var3;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t wVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  int local_5c;
  
  _Var3 = tval_is_ammo(obj);
  if ((_Var3) || (_Var4 = flag_has_dbg(obj->flags,6,0x29,"obj->flags","OF_THROWING"), _Var4)) {
    wVar5 = preferred_quiver_slot(obj);
    if (z_info->quiver_size == 0) {
      bVar9 = 0;
      bVar16 = false;
      iVar14 = 0;
      iVar13 = 0;
    }
    else {
      uVar15 = 0;
      iVar13 = 0;
      iVar14 = 0;
      local_5c = 0;
      bVar9 = 0;
      do {
        obj_00 = p->upkeep->quiver[uVar15];
        if (obj_00 == (object *)0x0) {
          local_5c = local_5c + 1;
          if ((uint)wVar5 == uVar15 || _Var3) {
            uVar1 = z_info->quiver_slot_size;
            goto LAB_001969a6;
          }
        }
        else {
          _Var4 = tval_is_ammo(obj_00);
          uVar11 = 1;
          if (!_Var4) {
            uVar11 = (uint)z_info->thrown_quiver_mult;
          }
          iVar13 = iVar13 + obj_00->number * uVar11;
          _Var4 = object_stackable(obj_00,obj,OSTACK_PACK);
          if (_Var4) {
            uVar11 = uVar11 * obj_00->number;
            uVar1 = z_info->quiver_slot_size;
            if (uVar1 < uVar11) {
              __assert_fail("quiver_obj->number * mult <= z_info->quiver_slot_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                            ,0x29e,
                            "void quiver_absorb_num(const struct player *, const struct object *, int *, int *)"
                           );
            }
            iVar14 = iVar14 - uVar11;
LAB_001969a6:
            iVar14 = iVar14 + (uint)uVar1;
          }
          else if (((uint)wVar5 == uVar15) &&
                  (wVar6 = preferred_quiver_slot(obj_00), uVar15 != (uint)wVar6)) {
            uVar11 = uVar11 * obj_00->number;
            if (z_info->quiver_slot_size < uVar11) {
              __assert_fail("quiver_obj->number * mult <= z_info->quiver_slot_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                            ,0x2ac,
                            "void quiver_absorb_num(const struct player *, const struct object *, int *, int *)"
                           );
            }
            if (_Var3) {
              iVar14 = iVar14 - uVar11;
            }
            iVar14 = iVar14 + (uint)z_info->quiver_slot_size;
            bVar9 = 1;
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < z_info->quiver_size);
      bVar16 = local_5c != 0;
    }
    if ((iVar14 != 0) && (bVar9 != 0xff || (bool)(bVar16 & bVar9))) {
      uVar11 = 1;
      if (!_Var3) {
        uVar11 = (uint)z_info->thrown_quiver_mult;
      }
      uVar1 = z_info->quiver_slot_size;
      uVar10 = iVar13 % (int)(uint)uVar1;
      iVar13 = uVar1 - uVar10;
      if (uVar10 == 0) {
        iVar13 = 0;
      }
      uVar12 = (uint)uVar1;
      iVar7 = 0;
      if (0 < *n_add_pack) {
        iVar7 = *n_add_pack * uVar12;
      }
      iVar2 = iVar7 + iVar13;
      if (iVar14 < iVar7 + iVar13) {
        iVar2 = iVar14;
      }
      uVar8 = iVar2 / (int)uVar11;
      if ((int)(uint)obj->number <= (int)uVar8) {
        uVar8 = (uint)obj->number;
      }
      *n_to_quiver = uVar8;
      *n_add_pack = *n_add_pack - (int)(uVar8 * uVar11 + ~uVar10 + uVar12) / (int)uVar12;
      return;
    }
  }
  *n_to_quiver = 0;
  return;
}

Assistant:

static void quiver_absorb_num(const struct player *p, const struct object *obj,
		int *n_add_pack, int *n_to_quiver)
{
	bool ammo = tval_is_ammo(obj);

	/* Must be ammo or good for throwing */
	if (ammo || of_has(obj->flags, OF_THROWING)) {
		int i, quiver_count = 0, space_free = 0, n_empty = 0;
		int desired_slot = preferred_quiver_slot(obj);
		bool displaces = false;

		/* Count the current space this object could go into. */
		for (i = 0; i < z_info->quiver_size; i++) {
			const struct object *quiver_obj = p->upkeep->quiver[i];
			if (quiver_obj) {
				int mult = tval_is_ammo(quiver_obj) ?
					1 : z_info->thrown_quiver_mult;

				quiver_count += quiver_obj->number * mult;
				if (object_stackable(quiver_obj, obj, OSTACK_PACK)) {
					assert(quiver_obj->number * mult <=
						z_info->quiver_slot_size);
					space_free += z_info->quiver_slot_size -
						quiver_obj->number * mult;
				} else if (desired_slot == i &&
						preferred_quiver_slot(quiver_obj) != i) {
					/*
					 * The object to be added prefers to go
					 * in this slot, but it's occupied by
					 * something that could be displaced
					 * to another quiver slot, if one is
					 * available.
					 */
					displaces = true;
					assert(quiver_obj->number * mult <=
						z_info->quiver_slot_size);
					/*
					 * Avoid double counting in the ammo
					 * case since the empty slot, if any,
					 * for the displaced stack is treated
					 * as fully available.
					 */
					if (ammo) {
						space_free += z_info->quiver_slot_size
							- quiver_obj->number
							* mult;
					} else {
						space_free += z_info->quiver_slot_size;
					}
				}
			} else {
				++n_empty;
				/*
				 * Ammo can fit in any empty slot in the quiver.
				 * Non-ammo throwing items are restricted to
				 * their preferred slot.
				 */
				if (ammo || desired_slot == i) {
					space_free += z_info->quiver_slot_size;
				}
			}
		}

		/*
		 * Only possible to add if there is space free in the quiver
		 * and either are displacing a pile with an empty quiver slot
		 * available for it or are not displacing a pile at all.
		 */
		if (space_free && ((displaces && n_empty) || !displaces)) {
			int mult = ammo ? 1 : z_info->thrown_quiver_mult;
			/*
			 * When quiver_count % quiver_slot_size is zero, adding
			 * anything will require a pack slot.
			 */
			int remainder = quiver_count % z_info->quiver_slot_size;
			int limit_from_pack = (remainder) ?
				z_info->quiver_slot_size - remainder : 0;

			if (*n_add_pack > 0) {
				limit_from_pack += *n_add_pack *
					z_info->quiver_slot_size;
			}

			/* Return the number or amount that fits. */
			space_free = MIN(space_free, limit_from_pack);
			*n_to_quiver = MIN(obj->number, space_free / mult);
			*n_add_pack -= (*n_to_quiver * mult +
				z_info->quiver_slot_size - 1 -
				remainder) / z_info->quiver_slot_size;
			return;
		}
	}

	/* Not suitable for the quiver or no space */
	*n_to_quiver = 0;
}